

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

string * __thiscall
pbrt::MIPMapFilterOptions::ToString_abi_cxx11_
          (string *__return_storage_ptr__,MIPMapFilterOptions *this)

{
  float *in_R8;
  
  StringPrintf<pbrt::FilterFunction_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ MIPMapFilterOptions filter: %s maxAnisotropy: %f ]",
             (char *)this,(FilterFunction *)&this->maxAnisotropy,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string MIPMapFilterOptions::ToString() const {
    return StringPrintf("[ MIPMapFilterOptions filter: %s maxAnisotropy: %f ]", filter,
                        maxAnisotropy);
}